

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O0

arrays_type * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>_>
::new_arrays_for_growth
          (table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>_>
           *this)

{
  size_t sVar1;
  size_t sVar2;
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>_>
  *in_RSI;
  arrays_type *in_RDI;
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>_>
  *unaff_retaddr;
  float local_c;
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>_>
  *n;
  
  n = in_RSI;
  sVar1 = size(in_RSI);
  sVar2 = size(in_RSI);
  local_c = (float)(sVar1 + 1 + sVar2 / 0x3d);
  std::ceil((double)(ulong)(uint)(local_c / 0.875));
  new_arrays(unaff_retaddr,(size_t)n);
  return in_RDI;
}

Assistant:

arrays_type new_arrays_for_growth() const {
        /* Due to the anti-drift mechanism (see recover_slot), the new arrays may
         * be of the same size as the old arrays; in the limit, erasing one
         * element at full load and then inserting could bring us back to the same
         * capacity after a costly rehash. To avoid this, we jump to the next
         * capacity level when the number of erased elements is <= 10% of total
         * elements at full load, which is implemented by requesting additional
         * F*size elements, with F = P * 10% / (1 - P * 10%), where P is the
         * probability of an element having caused overflow; P has been measured as
         * ~0.162 under ideal conditions, yielding F ~ 0.0165 ~ 1/61.
         */
        return new_arrays(
            std::size_t(std::ceil(static_cast<float>(size() + size() / 61 + 1) / mlf)));
    }